

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCas.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCascade(Abc_Ntk_t *pNtk,int nLutSize,int fCheck,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int nOutputs;
  abctime aVar4;
  void *pvVar5;
  DdManager *pDVar6;
  abctime aVar7;
  DdNode **pOutputs;
  Abc_Obj_t *pObj;
  DdNode *pDVar8;
  char *pFileGeneric_00;
  DdManager *dd_1;
  abctime clk;
  int local_58;
  int fReorder;
  int i;
  int fBddSizeMax;
  char *pFileGeneric;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  DdNode **ppOutputs;
  DdManager *dd;
  int fVerbose_local;
  int fCheck_local;
  int nLutSize_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar4 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCas.c"
                  ,0x47,"Abc_Ntk_t *Abc_NtkCascade(Abc_Ntk_t *, int, int, int)");
  }
  pvVar5 = Abc_NtkBuildGlobalBdds(pNtk,500000,1,1,0,fVerbose);
  if (pvVar5 == (void *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fVerbose != 0) {
      pDVar6 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
      uVar2 = Cudd_ReadKeys(pDVar6);
      uVar3 = Cudd_ReadDead(pDVar6);
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar2 - uVar3));
      Abc_Print(1,"%s =","BDD construction time");
      aVar7 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
    }
    pDVar6 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
    iVar1 = Abc_NtkCoNum(pNtk);
    pOutputs = (DdNode **)malloc((long)iVar1 << 3);
    for (local_58 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_58 < iVar1; local_58 = local_58 + 1) {
      pObj = Abc_NtkCo(pNtk,local_58);
      pDVar8 = (DdNode *)Abc_ObjGlobalBdd(pObj);
      pOutputs[local_58] = pDVar8;
    }
    pFileGeneric_00 = Extra_FileNameGeneric(pNtk->pSpec);
    iVar1 = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
    Abc_CascadeExperiment(pFileGeneric_00,pDVar6,pOutputs,iVar1,nOutputs,nLutSize,fCheck,fVerbose);
    pNtk_local = Abc_NtkDup(pNtk);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pOutputs != (DdNode **)0x0) {
      free(pOutputs);
    }
    if (pFileGeneric_00 != (char *)0x0) {
      free(pFileGeneric_00);
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkCollapse: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkCascade( Abc_Ntk_t * pNtk, int nLutSize, int fCheck, int fVerbose )
{
    DdManager * dd;
    DdNode ** ppOutputs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    char * pFileGeneric;
    int fBddSizeMax = 500000;
    int i, fReorder = 1;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, 0, fVerbose) == NULL )
        return NULL;

    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }

    // collect global BDDs
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    ppOutputs = ABC_ALLOC( DdNode *, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        ppOutputs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // call the decomposition
    pFileGeneric = Extra_FileNameGeneric( pNtk->pSpec );
    if ( !Abc_CascadeExperiment( pFileGeneric, dd, ppOutputs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), nLutSize, fCheck, fVerbose ) )
    {
        // the LUT size is too small
    }

    // for now, duplicate the network
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( ppOutputs );
    ABC_FREE( pFileGeneric );

//    if ( pNtk->pExdc )
//        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}